

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteMakeVariables
          (cmLocalUnixMakefileGenerator3 *this,ostream *makefileStream)

{
  cmOutputConverter *this_00;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  char *pcVar4;
  string cmakeShellCommand;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# Set environment variables for the build.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  if ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].MakeSilentFlag.
      field_2._M_local_buf[0] == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,"!IF \"$(OS)\" == \"Windows_NT\"\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"NULL=\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"!ELSE\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"NULL=nul\n",9);
    std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"!ENDIF\n",7);
  }
  bVar1 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
  if (bVar1) {
    pcVar4 = "SHELL = cmd.exe\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (makefileStream,"# The shell in which to execute make rules.\n",0x2c);
    pcVar4 = "SHELL = /bin/sh\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,pcVar4,0x10);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  MaybeConvertWatcomShellCommand(&local_48,this,psVar2);
  if (local_48._M_string_length == 0) {
    psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmsys::SystemTools::CollapseFullPath(&local_88,psVar2);
    cmOutputConverter::ConvertToOutputFormat
              (&local_68,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_88,SHELL);
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# The CMake executable.\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"CMAKE_COMMAND = ",0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (makefileStream,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# The command to remove a file.\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"RM = ",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (makefileStream,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," -E remove -f\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# Escaping for special characters.\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"EQUALS = =\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# The top-level source directory on which CMake was run.\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"CMAKE_SOURCE_DIR = ",0x13);
  psVar2 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmsys::SystemTools::CollapseFullPath(&local_88,psVar2);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&local_68,this_00,&local_88,SHELL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (makefileStream,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (makefileStream,"# The top-level build directory on which CMake was run.\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>(makefileStream,"CMAKE_BINARY_DIR = ",0x13);
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmsys::SystemTools::CollapseFullPath(&local_88,psVar2);
  cmOutputConverter::ConvertToOutputFormat(&local_68,this_00,&local_88,SHELL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (makefileStream,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteMakeVariables(
  std::ostream& makefileStream)
{
  this->WriteDivider(makefileStream);
  makefileStream << "# Set environment variables for the build.\n"
                 << "\n";
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (gg->DefineWindowsNULL) {
    makefileStream << "!IF \"$(OS)\" == \"Windows_NT\"\n"
                   << "NULL=\n"
                   << "!ELSE\n"
                   << "NULL=nul\n"
                   << "!ENDIF\n";
  }
  if (this->IsWindowsShell()) {
    makefileStream << "SHELL = cmd.exe\n"
                   << "\n";
  } else {
#if !defined(__VMS)
    /* clang-format off */
      makefileStream
        << "# The shell in which to execute make rules.\n"
        << "SHELL = /bin/sh\n"
        << "\n";
/* clang-format on */
#endif
  }

  std::string cmakeShellCommand =
    this->MaybeConvertWatcomShellCommand(cmSystemTools::GetCMakeCommand());
  if (cmakeShellCommand.empty()) {
    cmakeShellCommand = this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  /* clang-format off */
  makefileStream
    << "# The CMake executable.\n"
    << "CMAKE_COMMAND = "
    << cmakeShellCommand
    << "\n"
    << "\n";
  makefileStream
    << "# The command to remove a file.\n"
    << "RM = "
    << cmakeShellCommand
    << " -E remove -f\n"
    << "\n";
  makefileStream
    << "# Escaping for special characters.\n"
    << "EQUALS = =\n"
    << "\n";
  makefileStream
    << "# The top-level source directory on which CMake was run.\n"
    << "CMAKE_SOURCE_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetSourceDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  makefileStream
    << "# The top-level build directory on which CMake was run.\n"
    << "CMAKE_BINARY_DIR = "
    << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(this->GetBinaryDirectory()),
                     cmOutputConverter::SHELL)
    << "\n"
    << "\n";
  /* clang-format on */
}